

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void spirv_cross::ParsedIR::sanitize_identifier
               (string *name,bool member,bool allow_reserved_prefixes)

{
  bool bVar1;
  spirv_cross local_58 [32];
  spirv_cross local_38 [38];
  byte local_12;
  byte local_11;
  bool allow_reserved_prefixes_local;
  string *psStack_10;
  bool member_local;
  string *name_local;
  
  local_12 = allow_reserved_prefixes;
  local_11 = member;
  psStack_10 = name;
  bVar1 = is_valid_identifier(name);
  if (!bVar1) {
    ensure_valid_identifier(local_38,psStack_10);
    ::std::__cxx11::string::operator=((string *)psStack_10,(string *)local_38);
    ::std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = is_reserved_identifier(psStack_10,(bool)(local_11 & 1),(bool)(local_12 & 1));
  if (bVar1) {
    make_unreserved_identifier(local_58,psStack_10);
    ::std::__cxx11::string::operator=((string *)psStack_10,(string *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void ParsedIR::sanitize_identifier(std::string &name, bool member, bool allow_reserved_prefixes)
{
	if (!is_valid_identifier(name))
		name = ensure_valid_identifier(name);
	if (is_reserved_identifier(name, member, allow_reserved_prefixes))
		name = make_unreserved_identifier(name);
}